

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O0

void h2v1_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  int iVar1;
  int iVar2;
  jpeg_upsampler *pjVar3;
  JSAMPLE *pJVar4;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var5;
  long lVar6;
  _func_void_j_decompress_ptr *p_Var7;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  int cblue;
  int cgreen;
  int cred;
  int y;
  my_merged_upsample_ptr upsample;
  JLONG *Cbgtab_1;
  JLONG *Crgtab_1;
  int *Cbbtab_1;
  int *Crrtab_1;
  JSAMPLE *range_limit_1;
  JDIMENSION col_1;
  JSAMPROW inptr2_1;
  JSAMPROW inptr1_1;
  JSAMPROW inptr0_1;
  JSAMPROW outptr_1;
  int cr_1;
  int cb_1;
  int cblue_1;
  int cgreen_1;
  int cred_1;
  int y_1;
  my_merged_upsample_ptr upsample_1;
  JLONG *Cbgtab_2;
  JLONG *Crgtab_2;
  int *Cbbtab_2;
  int *Crrtab_2;
  JSAMPLE *range_limit_2;
  JDIMENSION col_2;
  JSAMPROW inptr2_2;
  JSAMPROW inptr1_2;
  JSAMPROW inptr0_2;
  JSAMPROW outptr_2;
  int cr_2;
  int cb_2;
  int cblue_2;
  int cgreen_2;
  int cred_2;
  int y_2;
  my_merged_upsample_ptr upsample_2;
  JLONG *Cbgtab_3;
  JLONG *Crgtab_3;
  int *Cbbtab_3;
  int *Crrtab_3;
  JSAMPLE *range_limit_3;
  JDIMENSION col_3;
  JSAMPROW inptr2_3;
  JSAMPROW inptr1_3;
  JSAMPROW inptr0_3;
  JSAMPROW outptr_3;
  int cr_3;
  int cb_3;
  int cblue_3;
  int cgreen_3;
  int cred_3;
  int y_3;
  my_merged_upsample_ptr upsample_3;
  JLONG *Cbgtab_4;
  JLONG *Crgtab_4;
  int *Cbbtab_4;
  int *Crrtab_4;
  JSAMPLE *range_limit_4;
  JDIMENSION col_4;
  JSAMPROW inptr2_4;
  JSAMPROW inptr1_4;
  JSAMPROW inptr0_4;
  JSAMPROW outptr_4;
  int cr_4;
  int cb_4;
  int cblue_4;
  int cgreen_4;
  int cred_4;
  int y_4;
  my_merged_upsample_ptr upsample_4;
  JLONG *Cbgtab_5;
  JLONG *Crgtab_5;
  int *Cbbtab_5;
  int *Crrtab_5;
  JSAMPLE *range_limit_5;
  JDIMENSION col_5;
  JSAMPROW inptr2_5;
  JSAMPROW inptr1_5;
  JSAMPROW inptr0_5;
  JSAMPROW outptr_5;
  int cr_5;
  int cb_5;
  int cblue_5;
  int cgreen_5;
  int cred_5;
  int y_5;
  my_merged_upsample_ptr upsample_5;
  JLONG *Cbgtab_6;
  JLONG *Crgtab_6;
  int *Cbbtab_6;
  int *Crrtab_6;
  JSAMPLE *range_limit_6;
  JDIMENSION col_6;
  JSAMPROW inptr2_6;
  JSAMPROW inptr1_6;
  JSAMPROW inptr0_6;
  JSAMPROW outptr_6;
  int cr_6;
  int cb_6;
  int cblue_6;
  int cgreen_6;
  int cred_6;
  int y_6;
  my_merged_upsample_ptr upsample_6;
  uint local_3c4;
  byte *local_3c0;
  byte *local_3b8;
  byte *local_3b0;
  JSAMPROW local_3a8;
  uint local_334;
  byte *local_330;
  byte *local_328;
  byte *local_320;
  JSAMPROW local_318;
  uint local_2a4;
  byte *local_2a0;
  byte *local_298;
  byte *local_290;
  JSAMPROW local_288;
  uint local_214;
  byte *local_210;
  byte *local_208;
  byte *local_200;
  JSAMPROW local_1f8;
  uint local_184;
  byte *local_180;
  byte *local_178;
  byte *local_170;
  JSAMPROW local_168;
  uint local_f4;
  byte *local_f0;
  byte *local_e8;
  byte *local_e0;
  JSAMPROW local_d8;
  JSAMPARRAY output_buf_local;
  JDIMENSION in_row_group_ctr_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  JLONG *Cbgtab;
  JLONG *Crgtab;
  int *Cbbtab;
  int *Crrtab;
  JSAMPLE *range_limit;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  int cr;
  int cb;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_3b0 = (*input_buf)[in_row_group_ctr];
    local_3a8 = *output_buf;
    local_3c0 = input_buf[2][in_row_group_ctr];
    local_3b8 = input_buf[1][in_row_group_ctr];
    for (local_3c4 = cinfo->output_width >> 1; local_3c4 != 0; local_3c4 = local_3c4 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_3c0 * 4);
      iVar11 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_3b8 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_3c0 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_3b8 * 4);
      pbVar13 = local_3b0 + 1;
      uVar12 = (uint)*local_3b0;
      *local_3a8 = pJVar4[(int)(uVar12 + iVar1)];
      local_3a8[1] = pJVar4[(int)(uVar12 + iVar11)];
      local_3a8[2] = pJVar4[(int)(uVar12 + iVar2)];
      local_3b0 = local_3b0 + 2;
      uVar12 = (uint)*pbVar13;
      local_3a8[3] = pJVar4[(int)(uVar12 + iVar1)];
      local_3a8[4] = pJVar4[(int)(uVar12 + iVar11)];
      local_3a8[5] = pJVar4[(int)(uVar12 + iVar2)];
      local_3a8 = local_3a8 + 6;
      local_3c0 = local_3c0 + 1;
      local_3b8 = local_3b8 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      lVar9 = *(long *)(p_Var8 + (long)(int)(uint)*local_3b8 * 8);
      lVar10 = *(long *)(p_Var7 + (long)(int)(uint)*local_3c0 * 8);
      iVar1 = *(int *)(lVar6 + (long)(int)(uint)*local_3b8 * 4);
      uVar12 = (uint)*local_3b0;
      *local_3a8 = pJVar4[(int)(uVar12 + *(int *)(p_Var5 + (long)(int)(uint)*local_3c0 * 4))];
      local_3a8[1] = pJVar4[(int)(uVar12 + (int)((ulong)(lVar9 + lVar10) >> 0x10))];
      local_3a8[2] = pJVar4[(int)(uVar12 + iVar1)];
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_320 = (*input_buf)[in_row_group_ctr];
    local_318 = *output_buf;
    local_330 = input_buf[2][in_row_group_ctr];
    local_328 = input_buf[1][in_row_group_ctr];
    for (local_334 = cinfo->output_width >> 1; local_334 != 0; local_334 = local_334 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_330 * 4);
      iVar11 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_328 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_330 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_328 * 4);
      pbVar13 = local_320 + 1;
      uVar12 = (uint)*local_320;
      *local_318 = pJVar4[(int)(uVar12 + iVar1)];
      local_318[1] = pJVar4[(int)(uVar12 + iVar11)];
      local_318[2] = pJVar4[(int)(uVar12 + iVar2)];
      local_318[3] = 0xff;
      local_320 = local_320 + 2;
      uVar12 = (uint)*pbVar13;
      local_318[4] = pJVar4[(int)(uVar12 + iVar1)];
      local_318[5] = pJVar4[(int)(uVar12 + iVar11)];
      local_318[6] = pJVar4[(int)(uVar12 + iVar2)];
      local_318[7] = 0xff;
      local_318 = local_318 + 8;
      local_330 = local_330 + 1;
      local_328 = local_328 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      lVar9 = *(long *)(p_Var8 + (long)(int)(uint)*local_328 * 8);
      lVar10 = *(long *)(p_Var7 + (long)(int)(uint)*local_330 * 8);
      iVar1 = *(int *)(lVar6 + (long)(int)(uint)*local_328 * 4);
      uVar12 = (uint)*local_320;
      *local_318 = pJVar4[(int)(uVar12 + *(int *)(p_Var5 + (long)(int)(uint)*local_330 * 4))];
      local_318[1] = pJVar4[(int)(uVar12 + (int)((ulong)(lVar9 + lVar10) >> 0x10))];
      local_318[2] = pJVar4[(int)(uVar12 + iVar1)];
      local_318[3] = 0xff;
    }
    break;
  case JCS_EXT_BGR:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_290 = (*input_buf)[in_row_group_ctr];
    local_288 = *output_buf;
    local_2a0 = input_buf[2][in_row_group_ctr];
    local_298 = input_buf[1][in_row_group_ctr];
    for (local_2a4 = cinfo->output_width >> 1; local_2a4 != 0; local_2a4 = local_2a4 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_2a0 * 4);
      iVar11 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_298 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_2a0 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_298 * 4);
      pbVar13 = local_290 + 1;
      uVar12 = (uint)*local_290;
      local_288[2] = pJVar4[(int)(uVar12 + iVar1)];
      local_288[1] = pJVar4[(int)(uVar12 + iVar11)];
      *local_288 = pJVar4[(int)(uVar12 + iVar2)];
      local_290 = local_290 + 2;
      uVar12 = (uint)*pbVar13;
      local_288[5] = pJVar4[(int)(uVar12 + iVar1)];
      local_288[4] = pJVar4[(int)(uVar12 + iVar11)];
      local_288[3] = pJVar4[(int)(uVar12 + iVar2)];
      local_288 = local_288 + 6;
      local_2a0 = local_2a0 + 1;
      local_298 = local_298 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      lVar9 = *(long *)(p_Var8 + (long)(int)(uint)*local_298 * 8);
      lVar10 = *(long *)(p_Var7 + (long)(int)(uint)*local_2a0 * 8);
      iVar1 = *(int *)(lVar6 + (long)(int)(uint)*local_298 * 4);
      uVar12 = (uint)*local_290;
      local_288[2] = pJVar4[(int)(uVar12 + *(int *)(p_Var5 + (long)(int)(uint)*local_2a0 * 4))];
      local_288[1] = pJVar4[(int)(uVar12 + (int)((ulong)(lVar9 + lVar10) >> 0x10))];
      *local_288 = pJVar4[(int)(uVar12 + iVar1)];
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_200 = (*input_buf)[in_row_group_ctr];
    local_1f8 = *output_buf;
    local_210 = input_buf[2][in_row_group_ctr];
    local_208 = input_buf[1][in_row_group_ctr];
    for (local_214 = cinfo->output_width >> 1; local_214 != 0; local_214 = local_214 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_210 * 4);
      iVar11 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_208 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_210 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_208 * 4);
      pbVar13 = local_200 + 1;
      uVar12 = (uint)*local_200;
      local_1f8[2] = pJVar4[(int)(uVar12 + iVar1)];
      local_1f8[1] = pJVar4[(int)(uVar12 + iVar11)];
      *local_1f8 = pJVar4[(int)(uVar12 + iVar2)];
      local_1f8[3] = 0xff;
      local_200 = local_200 + 2;
      uVar12 = (uint)*pbVar13;
      local_1f8[6] = pJVar4[(int)(uVar12 + iVar1)];
      local_1f8[5] = pJVar4[(int)(uVar12 + iVar11)];
      local_1f8[4] = pJVar4[(int)(uVar12 + iVar2)];
      local_1f8[7] = 0xff;
      local_1f8 = local_1f8 + 8;
      local_210 = local_210 + 1;
      local_208 = local_208 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      lVar9 = *(long *)(p_Var8 + (long)(int)(uint)*local_208 * 8);
      lVar10 = *(long *)(p_Var7 + (long)(int)(uint)*local_210 * 8);
      iVar1 = *(int *)(lVar6 + (long)(int)(uint)*local_208 * 4);
      uVar12 = (uint)*local_200;
      local_1f8[2] = pJVar4[(int)(uVar12 + *(int *)(p_Var5 + (long)(int)(uint)*local_210 * 4))];
      local_1f8[1] = pJVar4[(int)(uVar12 + (int)((ulong)(lVar9 + lVar10) >> 0x10))];
      *local_1f8 = pJVar4[(int)(uVar12 + iVar1)];
      local_1f8[3] = 0xff;
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_170 = (*input_buf)[in_row_group_ctr];
    local_168 = *output_buf;
    local_180 = input_buf[2][in_row_group_ctr];
    local_178 = input_buf[1][in_row_group_ctr];
    for (local_184 = cinfo->output_width >> 1; local_184 != 0; local_184 = local_184 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_180 * 4);
      iVar11 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_178 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_180 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_178 * 4);
      pbVar13 = local_170 + 1;
      uVar12 = (uint)*local_170;
      local_168[3] = pJVar4[(int)(uVar12 + iVar1)];
      local_168[2] = pJVar4[(int)(uVar12 + iVar11)];
      local_168[1] = pJVar4[(int)(uVar12 + iVar2)];
      *local_168 = 0xff;
      local_170 = local_170 + 2;
      uVar12 = (uint)*pbVar13;
      local_168[7] = pJVar4[(int)(uVar12 + iVar1)];
      local_168[6] = pJVar4[(int)(uVar12 + iVar11)];
      local_168[5] = pJVar4[(int)(uVar12 + iVar2)];
      local_168[4] = 0xff;
      local_168 = local_168 + 8;
      local_180 = local_180 + 1;
      local_178 = local_178 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      lVar9 = *(long *)(p_Var8 + (long)(int)(uint)*local_178 * 8);
      lVar10 = *(long *)(p_Var7 + (long)(int)(uint)*local_180 * 8);
      iVar1 = *(int *)(lVar6 + (long)(int)(uint)*local_178 * 4);
      uVar12 = (uint)*local_170;
      local_168[3] = pJVar4[(int)(uVar12 + *(int *)(p_Var5 + (long)(int)(uint)*local_180 * 4))];
      local_168[2] = pJVar4[(int)(uVar12 + (int)((ulong)(lVar9 + lVar10) >> 0x10))];
      local_168[1] = pJVar4[(int)(uVar12 + iVar1)];
      *local_168 = 0xff;
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    local_e0 = (*input_buf)[in_row_group_ctr];
    local_d8 = *output_buf;
    local_f0 = input_buf[2][in_row_group_ctr];
    local_e8 = input_buf[1][in_row_group_ctr];
    for (local_f4 = cinfo->output_width >> 1; local_f4 != 0; local_f4 = local_f4 - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*local_f0 * 4);
      iVar11 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*local_e8 * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*local_f0 * 8)) >> 0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)*local_e8 * 4);
      pbVar13 = local_e0 + 1;
      uVar12 = (uint)*local_e0;
      local_d8[1] = pJVar4[(int)(uVar12 + iVar1)];
      local_d8[2] = pJVar4[(int)(uVar12 + iVar11)];
      local_d8[3] = pJVar4[(int)(uVar12 + iVar2)];
      *local_d8 = 0xff;
      local_e0 = local_e0 + 2;
      uVar12 = (uint)*pbVar13;
      local_d8[5] = pJVar4[(int)(uVar12 + iVar1)];
      local_d8[6] = pJVar4[(int)(uVar12 + iVar11)];
      local_d8[7] = pJVar4[(int)(uVar12 + iVar2)];
      local_d8[4] = 0xff;
      local_d8 = local_d8 + 8;
      local_f0 = local_f0 + 1;
      local_e8 = local_e8 + 1;
    }
    if ((cinfo->output_width & 1) != 0) {
      lVar9 = *(long *)(p_Var8 + (long)(int)(uint)*local_e8 * 8);
      lVar10 = *(long *)(p_Var7 + (long)(int)(uint)*local_f0 * 8);
      iVar1 = *(int *)(lVar6 + (long)(int)(uint)*local_e8 * 4);
      uVar12 = (uint)*local_e0;
      local_d8[1] = pJVar4[(int)(uVar12 + *(int *)(p_Var5 + (long)(int)(uint)*local_f0 * 4))];
      local_d8[2] = pJVar4[(int)(uVar12 + (int)((ulong)(lVar9 + lVar10) >> 0x10))];
      local_d8[3] = pJVar4[(int)(uVar12 + iVar1)];
      *local_d8 = 0xff;
    }
    break;
  default:
    pjVar3 = cinfo->upsample;
    pJVar4 = cinfo->sample_range_limit;
    p_Var5 = pjVar3[1].upsample;
    lVar6 = *(long *)&pjVar3[1].need_context_rows;
    p_Var7 = pjVar3[2].start_pass;
    p_Var8 = pjVar3[2].upsample;
    Crgtab = (JLONG *)(*input_buf)[in_row_group_ctr];
    Cbbtab = (int *)*output_buf;
    cinfo_local = (j_decompress_ptr)input_buf[2][in_row_group_ctr];
    Cbgtab = (JLONG *)input_buf[1][in_row_group_ctr];
    for (input_buf_local._4_4_ = cinfo->output_width >> 1; input_buf_local._4_4_ != 0;
        input_buf_local._4_4_ = input_buf_local._4_4_ - 1) {
      iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*(byte *)&cinfo_local->err * 4);
      iVar11 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)(byte)*Cbgtab * 8) +
                            *(long *)(p_Var7 + (long)(int)(uint)*(byte *)&cinfo_local->err * 8)) >>
                    0x10);
      iVar2 = *(int *)(lVar6 + (long)(int)(uint)(byte)*Cbgtab * 4);
      pbVar13 = (byte *)((long)Crgtab + 1);
      uVar12 = (uint)(byte)*Crgtab;
      *(JSAMPLE *)Cbbtab = pJVar4[(int)(uVar12 + iVar1)];
      *(JSAMPLE *)((long)Cbbtab + 1) = pJVar4[(int)(uVar12 + iVar11)];
      *(JSAMPLE *)((long)Cbbtab + 2) = pJVar4[(int)(uVar12 + iVar2)];
      Crgtab = (JLONG *)((long)Crgtab + 2);
      uVar12 = (uint)*pbVar13;
      *(JSAMPLE *)((long)Cbbtab + 3) = pJVar4[(int)(uVar12 + iVar1)];
      *(JSAMPLE *)(Cbbtab + 1) = pJVar4[(int)(uVar12 + iVar11)];
      *(JSAMPLE *)((long)Cbbtab + 5) = pJVar4[(int)(uVar12 + iVar2)];
      Cbbtab = (int *)((long)Cbbtab + 6);
      cinfo_local = (j_decompress_ptr)((long)&cinfo_local->err + 1);
      Cbgtab = (JLONG *)((long)Cbgtab + 1);
    }
    if ((cinfo->output_width & 1) != 0) {
      lVar9 = *(long *)(p_Var8 + (long)(int)(uint)(byte)*Cbgtab * 8);
      lVar10 = *(long *)(p_Var7 + (long)(int)(uint)*(byte *)&cinfo_local->err * 8);
      iVar1 = *(int *)(lVar6 + (long)(int)(uint)(byte)*Cbgtab * 4);
      uVar12 = (uint)(byte)*Crgtab;
      *(JSAMPLE *)Cbbtab =
           pJVar4[(int)(uVar12 + *(int *)(p_Var5 + (long)(int)(uint)*(byte *)&cinfo_local->err * 4))
                 ];
      *(JSAMPLE *)((long)Cbbtab + 1) =
           pJVar4[(int)(uVar12 + (int)((ulong)(lVar9 + lVar10) >> 0x10))];
      *(JSAMPLE *)((long)Cbbtab + 2) = pJVar4[(int)(uVar12 + iVar1)];
    }
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                     JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    extrgb_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_BGR:
    extbgr_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  default:
    h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                  output_buf);
    break;
  }
}